

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.cpp
# Opt level: O0

Debug * Corrade::Utility::operator<<(Debug *debug,Flag value)

{
  Debug *pDVar1;
  Flag value_local;
  Debug *debug_local;
  
  if (value == Hex) {
    debug_local = Debug::operator<<(debug,"Utility::Debug::Flag::Hex");
  }
  else if (value == NoNewlineAtTheEnd) {
    debug_local = Debug::operator<<(debug,"Utility::Debug::Flag::NoNewlineAtTheEnd");
  }
  else if (value == DisableColors) {
    debug_local = Debug::operator<<(debug,"Utility::Debug::Flag::DisableColors");
  }
  else if (value == NoSpace) {
    debug_local = Debug::operator<<(debug,"Utility::Debug::Flag::NoSpace");
  }
  else if (value == Packed) {
    debug_local = Debug::operator<<(debug,"Utility::Debug::Flag::Packed");
  }
  else if (value == Color) {
    debug_local = Debug::operator<<(debug,"Utility::Debug::Flag::Color");
  }
  else {
    pDVar1 = Debug::operator<<(debug,"Utility::Debug::Flag(");
    pDVar1 = Debug::operator<<(pDVar1,Debug::nospace);
    pDVar1 = Debug::operator<<(pDVar1,Debug::hex);
    pDVar1 = Debug::operator<<(pDVar1,value);
    pDVar1 = Debug::operator<<(pDVar1,Debug::nospace);
    debug_local = Debug::operator<<(pDVar1,")");
  }
  return debug_local;
}

Assistant:

Debug& operator<<(Debug& debug, Debug::Flag value) {
    switch(value) {
        /* LCOV_EXCL_START */
        #define _c(value) case Debug::Flag::value: return debug << "Utility::Debug::Flag::" #value;
        _c(NoNewlineAtTheEnd)
        _c(DisableColors)
        _c(NoSpace)
        _c(Packed)
        _c(Color)
        /* Space reserved for Bin and Oct */
        _c(Hex)
        #undef _c
        /* LCOV_EXCL_STOP */
    }

    return debug << "Utility::Debug::Flag(" << Debug::nospace << Debug::hex << static_cast<unsigned char>(value) << Debug::nospace << ")";
}